

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

void __thiscall
testing::internal::ParameterizedTestCaseInfo<PushPopTest>::AddTestPattern
          (ParameterizedTestCaseInfo<PushPopTest> *this,char *test_case_name,char *test_base_name,
          TestMetaFactoryBase<unsigned_long> *meta_factory)

{
  TestInfo *this_00;
  linked_ptr<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::TestInfo> local_38;
  
  this_00 = (TestInfo *)operator_new(0x48);
  TestInfo::TestInfo(this_00,test_case_name,test_base_name,meta_factory);
  local_38.link_.next_ = &local_38.link_;
  local_38.value_ = this_00;
  std::
  vector<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::TestInfo>,std::allocator<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::TestInfo>>>
  ::
  emplace_back<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::TestInfo>>
            ((vector<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::TestInfo>,std::allocator<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::TestInfo>>>
              *)&this->tests_,&local_38);
  linked_ptr<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::TestInfo>::depart(&local_38)
  ;
  return;
}

Assistant:

void AddTestPattern(const char* test_case_name,
                      const char* test_base_name,
                      TestMetaFactoryBase<ParamType>* meta_factory) {
    tests_.push_back(linked_ptr<TestInfo>(new TestInfo(test_case_name,
                                                       test_base_name,
                                                       meta_factory)));
  }